

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O3

RPCHelpMan * wallet::listreceivedbylabel(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong *puVar3;
  string name;
  string name_00;
  string name_01;
  string name_02;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  undefined1 auVar4 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  RPCHelpMan *in_RDI;
  undefined8 uVar6;
  long lVar7;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined4 in_stack_ffffffffffffef48;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffef4c;
  undefined8 in_stack_ffffffffffffef58;
  undefined8 in_stack_ffffffffffffef60;
  undefined8 in_stack_ffffffffffffef68;
  code *pcVar9;
  undefined8 in_stack_ffffffffffffef70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffef78;
  pointer in_stack_ffffffffffffef88;
  pointer in_stack_ffffffffffffef90;
  pointer pRVar10;
  pointer in_stack_ffffffffffffef98;
  pointer pRVar11;
  undefined8 in_stack_ffffffffffffefa0;
  pointer in_stack_ffffffffffffefa8;
  pointer pRVar12;
  pointer in_stack_ffffffffffffefb0;
  pointer pRVar13;
  pointer in_stack_ffffffffffffefb8;
  pointer pRVar14;
  undefined8 in_stack_ffffffffffffefc0;
  pointer in_stack_ffffffffffffefc8;
  pointer pRVar15;
  pointer pRVar16;
  pointer pRVar17;
  pointer in_stack_ffffffffffffefd8;
  undefined8 in_stack_ffffffffffffefe0;
  pointer in_stack_ffffffffffffefe8;
  pointer in_stack_ffffffffffffeff0;
  pointer in_stack_ffffffffffffeff8;
  undefined1 in_stack_fffffffffffff000 [48];
  RPCResults local_fc8;
  allocator_type local_faf;
  bool local_fae;
  bool local_fad;
  int local_fac;
  vector<RPCArg,_std::allocator<RPCArg>_> local_fa8;
  string local_f90;
  string local_f70;
  string local_f50;
  string local_f30;
  string local_f10;
  string local_ef0;
  string local_ed0;
  string local_eb0;
  string local_e90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e70;
  ulong *local_e50;
  undefined8 local_e48;
  ulong local_e40;
  undefined8 uStack_e38;
  ulong *local_e30;
  size_type local_e28;
  ulong local_e20;
  undefined8 uStack_e18;
  long *local_e10 [2];
  long local_e00 [2];
  long *local_df0 [2];
  long local_de0 [2];
  long *local_dd0 [2];
  long local_dc0 [2];
  long *local_db0 [2];
  long local_da0 [2];
  long *local_d90 [2];
  long local_d80 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_d70;
  long *local_d50 [2];
  long local_d40 [2];
  pointer local_d30 [2];
  undefined1 local_d20 [152];
  RPCResult local_c88;
  RPCResult local_c00;
  RPCResult local_b78;
  long *local_af0 [2];
  long local_ae0 [2];
  long *local_ad0 [2];
  long local_ac0 [2];
  RPCResult local_ab0;
  long *local_a28 [2];
  long local_a18 [2];
  long *local_a08 [2];
  long local_9f8 [2];
  RPCResult local_9e8;
  undefined1 local_960;
  undefined1 *local_958;
  undefined8 local_950;
  undefined1 local_948;
  undefined7 uStack_947;
  undefined1 local_938 [32];
  long *local_918 [2];
  long local_908 [2];
  UniValue local_8f8;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_8a0;
  undefined1 local_848;
  long *local_840 [2];
  long local_830 [2];
  undefined1 local_820;
  undefined1 *local_818;
  undefined8 local_810;
  undefined1 local_808;
  undefined7 uStack_807;
  undefined1 local_7f8 [32];
  long *local_7d8 [2];
  long local_7c8 [2];
  uint *local_7b8;
  undefined8 local_7b0;
  uint local_7a8;
  undefined4 uStack_7a4;
  undefined4 uStack_7a0;
  undefined4 uStack_79c;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_798;
  undefined1 local_740;
  long *local_738 [2];
  long local_728 [2];
  undefined1 local_718;
  undefined1 *local_710;
  undefined8 local_708;
  undefined1 local_700;
  undefined7 uStack_6ff;
  undefined1 local_6f0 [32];
  long *local_6d0 [2];
  long local_6c0 [2];
  UniValue local_6b0;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_658;
  undefined1 local_600;
  long *local_5f8 [2];
  long local_5e8 [2];
  undefined1 local_5d8;
  undefined1 *local_5d0;
  undefined8 local_5c8;
  undefined1 local_5c0;
  undefined7 uStack_5bf;
  undefined1 local_5b0 [32];
  long *local_590 [2];
  long local_580;
  undefined1 auStack_578 [8];
  undefined1 local_570 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_548;
  vector<UniValue,_std::allocator<UniValue>_> local_530;
  undefined1 local_518 [40];
  long local_4f0 [6];
  __index_type local_4c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b8;
  RPCArg local_498;
  RPCArg local_390;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  pRVar16 = (pointer)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"listreceivedbylabel","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"\nList received transactions by label.\n","");
  local_4b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_4b8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"minconf","");
  local_fac = 1;
  UniValue::UniValue<int,_int,_true>((UniValue *)local_570,&local_fac);
  local_518._8_8_ = local_518 + 0x18;
  local_518._0_4_ = local_570._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._8_8_ == &local_558) {
    local_518._32_8_ = local_558._8_8_;
  }
  else {
    local_518._8_8_ = local_570._8_8_;
  }
  local_518._16_8_ = local_570._16_8_;
  local_570._16_8_ = 0;
  local_558._M_local_buf[0] = '\0';
  local_4f0[0] = (long)local_548.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_4f0[1] = (long)local_548.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  local_4f0[2] = (long)local_548.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_548.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_548.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_548.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4f0[3]._0_4_ =
       local_530.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_4f0[3]._4_4_ =
       local_530.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_4f0[4]._0_4_ =
       local_530.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_4f0[4]._4_4_ =
       local_530.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_4f0[5] = (long)local_530.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  local_530.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_530.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_530.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4c0 = '\x02';
  local_590[0] = &local_580;
  local_570._8_8_ = &local_558;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_590,"The minimum number of confirmations before payments are included."
             ,"");
  local_5d0 = &local_5c0;
  local_5d8 = 0;
  local_5c8 = 0;
  local_5c0 = 0;
  local_5b0._0_8_ = (pointer)0x0;
  local_5b0._8_2_ = 0;
  local_5b0._10_6_ = 0;
  local_5b0._16_2_ = 0;
  local_5b0._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef4c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffef48;
  name._M_string_length = (size_type)in_RDI;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffef58;
  name.field_2._8_8_ = in_stack_ffffffffffffef60;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffef70;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffef68;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffef78;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffef88;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffef90;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffef98;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffefa0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffefa8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffefb0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffefb8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffefc0;
  description_06._M_string_length = (size_type)pRVar16;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffefc8;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffefd8;
  description_06.field_2._8_8_ = in_stack_ffffffffffffefe0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeff0;
  opts._0_8_ = in_stack_ffffffffffffefe8;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeff8;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff000._0_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff000._16_24_;
  opts.hidden = (bool)in_stack_fffffffffffff000[0x28];
  opts.also_positional = (bool)in_stack_fffffffffffff000[0x29];
  opts._66_6_ = in_stack_fffffffffffff000._42_6_;
  ::RPCArg::RPCArg(&local_498,name,(Type)&local_4b8,fallback,description_06,opts);
  local_5f8[0] = local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"include_empty","");
  local_fad = false;
  UniValue::UniValue<bool,_bool,_true>(&local_6b0,&local_fad);
  paVar1 = &local_6b0.val.field_2;
  local_658._8_8_ = (long)&local_658 + 0x18;
  local_658._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_6b0.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0.val._M_dataplus._M_p == paVar1) {
    local_658._32_8_ = local_6b0.val.field_2._8_8_;
  }
  else {
    local_658._8_8_ = local_6b0.val._M_dataplus._M_p;
  }
  local_658._16_8_ = local_6b0.val._M_string_length;
  local_6b0.val._M_string_length = 0;
  local_6b0.val.field_2._M_local_buf[0] = '\0';
  local_658._40_8_ =
       local_6b0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_658._48_8_ =
       local_6b0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_658._56_8_ =
       local_6b0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_6b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_658._64_4_ =
       local_6b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_658._68_4_ =
       local_6b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_658._72_4_ =
       local_6b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_658._76_4_ =
       local_6b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_658._80_8_ =
       local_6b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_6b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_600 = 2;
  local_6d0[0] = local_6c0;
  local_6b0.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6d0,"Whether to include labels that haven\'t received any payments.",""
            );
  local_710 = &local_700;
  local_718 = 0;
  local_708 = 0;
  local_700 = 0;
  local_6f0._0_8_ = (pointer)0x0;
  local_6f0._8_2_ = 0;
  local_6f0._10_6_ = 0;
  local_6f0._16_2_ = 0;
  local_6f0._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef4c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffef48;
  name_00._M_string_length = (size_type)in_RDI;
  name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffef58;
  name_00.field_2._8_8_ = in_stack_ffffffffffffef60;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffef70;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffef68;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffef78;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffef88;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffef90;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffef98;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffefa0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffefa8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffefb0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffefb8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffefc0;
  description_07._M_string_length = (size_type)pRVar16;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffefc8;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffefd8;
  description_07.field_2._8_8_ = in_stack_ffffffffffffefe0;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeff0;
  opts_00._0_8_ = in_stack_ffffffffffffefe8;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeff8;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff000._0_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff000._16_24_;
  opts_00.hidden = (bool)in_stack_fffffffffffff000[0x28];
  opts_00.also_positional = (bool)in_stack_fffffffffffff000[0x29];
  opts_00._66_6_ = in_stack_fffffffffffff000._42_6_;
  ::RPCArg::RPCArg(&local_390,name_00,(Type)local_5f8,fallback_00,description_07,opts_00);
  local_738[0] = local_728;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_738,"include_watchonly","");
  local_7b8 = &local_7a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7b8,"true for watch-only wallets, otherwise false","");
  local_798._0_8_ = (long)&local_798 + 0x10;
  if (local_7b8 == &local_7a8) {
    local_798._24_4_ = uStack_7a0;
    local_798._28_4_ = uStack_79c;
  }
  else {
    local_798._0_8_ = local_7b8;
  }
  local_798._8_8_ = local_7b0;
  local_7b0 = 0;
  local_7a8 = local_7a8 & 0xffffff00;
  local_740 = 1;
  local_7d8[0] = local_7c8;
  local_7b8 = &local_7a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7d8,"Whether to include watch-only addresses (see \'importaddress\')",
             "");
  local_818 = &local_808;
  local_820 = 0;
  local_810 = 0;
  local_808 = 0;
  local_7f8._0_8_ = (pointer)0x0;
  local_7f8._8_2_ = 0;
  local_7f8._10_6_ = 0;
  local_7f8._16_2_ = 0;
  local_7f8._18_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef4c;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffef48;
  name_01._M_string_length = (size_type)in_RDI;
  name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffef58;
  name_01.field_2._8_8_ = in_stack_ffffffffffffef60;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffef70;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffef68;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffef78;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffef88;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffef90;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffef98;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffefa0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffefa8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffefb0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffefb8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffefc0;
  description_08._M_string_length = (size_type)pRVar16;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffefc8;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffefd8;
  description_08.field_2._8_8_ = in_stack_ffffffffffffefe0;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeff0;
  opts_01._0_8_ = in_stack_ffffffffffffefe8;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeff8;
  opts_01.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff000._0_16_;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff000._16_24_;
  opts_01.hidden = (bool)in_stack_fffffffffffff000[0x28];
  opts_01.also_positional = (bool)in_stack_fffffffffffff000[0x29];
  opts_01._66_6_ = in_stack_fffffffffffff000._42_6_;
  ::RPCArg::RPCArg(&local_288,name_01,(Type)local_738,fallback_01,description_08,opts_01);
  local_840[0] = local_830;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_840,"include_immature_coinbase","");
  local_fae = false;
  UniValue::UniValue<bool,_bool,_true>(&local_8f8,&local_fae);
  paVar1 = &local_8f8.val.field_2;
  local_8a0._8_8_ = (long)&local_8a0 + 0x18;
  local_8a0._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_8f8.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f8.val._M_dataplus._M_p == paVar1) {
    local_8a0._32_8_ = local_8f8.val.field_2._8_8_;
  }
  else {
    local_8a0._8_8_ = local_8f8.val._M_dataplus._M_p;
  }
  local_8a0._16_8_ = local_8f8.val._M_string_length;
  local_8f8.val._M_string_length = 0;
  local_8f8.val.field_2._M_local_buf[0] = '\0';
  local_8a0._40_8_ =
       local_8f8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_8a0._48_8_ =
       local_8f8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_8a0._56_8_ =
       local_8f8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_8f8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8f8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8f8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8a0._64_4_ =
       local_8f8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_8a0._68_4_ =
       local_8f8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_8a0._72_4_ =
       local_8f8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_8a0._76_4_ =
       local_8f8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_8a0._80_8_ =
       local_8f8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_8f8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_8f8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8f8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_848 = 2;
  local_918[0] = local_908;
  local_8f8.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_918,"Include immature coinbase transactions.","");
  local_958 = &local_948;
  local_960 = 0;
  local_950 = 0;
  local_948 = 0;
  local_938._0_8_ = (pointer)0x0;
  local_938._8_2_ = 0;
  local_938._10_6_ = 0;
  local_938._16_2_ = 0;
  local_938._18_8_ = 0;
  name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef4c;
  name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffef48;
  name_02._M_string_length = (size_type)in_RDI;
  name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffef58;
  name_02.field_2._8_8_ = in_stack_ffffffffffffef60;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffef70;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffef68;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffef78;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffef88;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffef90;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffef98;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffefa0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffefa8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffefb0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffefb8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffefc0;
  description_09._M_string_length = (size_type)pRVar16;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffefc8;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffefd8;
  description_09.field_2._8_8_ = in_stack_ffffffffffffefe0;
  opts_02.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeff0;
  opts_02._0_8_ = in_stack_ffffffffffffefe8;
  opts_02.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeff8;
  opts_02.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff000._0_16_;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff000._16_24_;
  opts_02.hidden = (bool)in_stack_fffffffffffff000[0x28];
  opts_02.also_positional = (bool)in_stack_fffffffffffff000[0x29];
  opts_02._66_6_ = in_stack_fffffffffffff000._42_6_;
  ::RPCArg::RPCArg(&local_180,name_02,(Type)local_840,fallback_02,description_09,opts_02);
  __l._M_len = 4;
  __l._M_array = &local_498;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_fa8,__l,&local_faf);
  local_a08[0] = local_9f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a08,"");
  local_a28[0] = local_a18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a28,"");
  local_ad0[0] = local_ac0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ad0,"");
  local_af0[0] = local_ae0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_af0,"");
  local_d30[0] = (pointer)local_d20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d30,"involvesWatchonly","");
  local_d50[0] = local_d40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d50,
             "Only returns true if imported addresses were involved in transaction","");
  uVar8 = 0;
  auVar4._4_8_ = in_RDI;
  auVar4._0_4_ = in_stack_ffffffffffffef4c;
  auVar4._12_8_ = in_stack_ffffffffffffef58;
  auVar4._20_8_ = in_stack_ffffffffffffef60;
  auVar4._28_4_ = 0;
  description._M_string_length = in_stack_ffffffffffffef70;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef68;
  description.field_2 = in_stack_ffffffffffffef78;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffef90;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffef88;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffef98;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_d20 + 0x10),BOOL,(string)(auVar4 << 0x20),SUB81(local_d30,0),
             description,inner,true);
  local_d70.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_d70.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d70,"amount","");
  local_d90[0] = local_d80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d90,"The total amount received by addresses with this label","");
  pRVar15 = (pointer)0x0;
  pRVar17 = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef4c;
  m_key_name._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffef58;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffef60;
  description_00._M_string_length = in_stack_ffffffffffffef70;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef68;
  description_00.field_2 = in_stack_ffffffffffffef78;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffef90;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffef88;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef98;
  ::RPCResult::RPCResult
            (&local_c88,STR_AMOUNT,m_key_name,description_00,inner_00,SUB81(&local_d70,0));
  local_db0[0] = local_da0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_db0,"confirmations","");
  local_dd0[0] = local_dc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_dd0,
             "The number of confirmations of the most recent transaction included","");
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef4c;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffef58;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffef60;
  description_01._M_string_length = in_stack_ffffffffffffef70;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef68;
  description_01.field_2 = in_stack_ffffffffffffef78;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffef90;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffef88;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef98;
  ::RPCResult::RPCResult(&local_c00,NUM,m_key_name_00,description_01,inner_01,SUB81(local_db0,0));
  local_df0[0] = local_de0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_df0,"label","");
  local_e10[0] = local_e00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e10,"The label of the receiving address. The default label is \"\"","")
  ;
  pRVar16 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef4c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffef58;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffef60;
  description_02._M_string_length = in_stack_ffffffffffffef70;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef68;
  description_02.field_2._M_local_buf = in_stack_ffffffffffffef78._M_local_buf;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  ::RPCResult::RPCResult(&local_b78,STR,m_key_name_01,description_02,inner_02,SUB81(local_df0,0));
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)(local_d20 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff008,__l_00,
             (allocator_type *)&stack0xffffffffffffef87);
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef4c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffef58;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffef60;
  description_03._M_string_length = in_stack_ffffffffffffef70;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef68;
  description_03.field_2._M_local_buf = in_stack_ffffffffffffef78._M_local_buf;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar10;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar16;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar11;
  ::RPCResult::RPCResult(&local_ab0,OBJ,m_key_name_02,description_03,inner_03,SUB81(local_ad0,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_ab0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff020,__l_01,
             (allocator_type *)&stack0xffffffffffffef86);
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef4c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffef58;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffef60;
  description_04._M_string_length = in_stack_ffffffffffffef70;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef68;
  description_04.field_2 = in_stack_ffffffffffffef78;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar10;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar16;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar11;
  ::RPCResult::RPCResult(&local_9e8,ARR,m_key_name_03,description_04,inner_04,SUB81(local_a08,0));
  result._4_4_ = in_stack_ffffffffffffef4c;
  result.m_type = uVar8;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_ffffffffffffef58;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffef60;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffef68;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef70;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffef78;
  result._64_8_ = pRVar16;
  result.m_description._M_dataplus._M_p = (pointer)pRVar10;
  result.m_description._M_string_length = (size_type)pRVar11;
  result.m_description.field_2._M_allocated_capacity = in_stack_ffffffffffffefa0;
  result.m_description.field_2._8_8_ = pRVar12;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar13;
  result.m_cond._M_string_length = (size_type)pRVar14;
  result.m_cond.field_2._M_allocated_capacity = in_stack_ffffffffffffefc0;
  result.m_cond.field_2._8_8_ = pRVar15;
  RPCResults::RPCResults(&local_fc8,result);
  local_eb0._M_dataplus._M_p = (pointer)&local_eb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_eb0,"listreceivedbylabel","");
  local_ed0._M_dataplus._M_p = (pointer)&local_ed0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ed0,"");
  HelpExampleCli(&local_e90,&local_eb0,&local_ed0);
  local_f10._M_dataplus._M_p = (pointer)&local_f10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f10,"listreceivedbylabel","");
  local_f30._M_dataplus._M_p = (pointer)&local_f30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f30,"6 true","");
  HelpExampleCli(&local_ef0,&local_f10,&local_f30);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90._M_dataplus._M_p != &local_e90.field_2) {
    uVar6 = local_e90.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_ef0._M_string_length + local_e90._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ef0._M_dataplus._M_p != &local_ef0.field_2) {
      uVar6 = local_ef0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_ef0._M_string_length + local_e90._M_string_length) goto LAB_002fe317;
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_ef0,0,0,local_e90._M_dataplus._M_p,local_e90._M_string_length);
  }
  else {
LAB_002fe317:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_e90,local_ef0._M_dataplus._M_p,local_ef0._M_string_length);
  }
  local_e70._M_dataplus._M_p = (pointer)&local_e70.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar1 = &pbVar5->field_2;
  if (paVar2 == paVar1) {
    local_e70.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_e70.field_2._8_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 8);
    local_e70.field_2._12_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
  }
  else {
    local_e70.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_e70._M_dataplus._M_p = (pointer)paVar2;
  }
  local_e70._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar5->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_f70._M_dataplus._M_p = (pointer)&local_f70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f70,"listreceivedbylabel","");
  local_f90._M_dataplus._M_p = (pointer)&local_f90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f90,"6, true, true, true","");
  HelpExampleRpc(&local_f50,&local_f70,&local_f90);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e70._M_dataplus._M_p != &local_e70.field_2) {
    uVar6 = local_e70.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_f50._M_string_length + local_e70._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f50._M_dataplus._M_p != &local_f50.field_2) {
      uVar6 = local_f50.field_2._M_allocated_capacity;
    }
    if (local_f50._M_string_length + local_e70._M_string_length <= (ulong)uVar6) {
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_f50,0,0,local_e70._M_dataplus._M_p,local_e70._M_string_length);
      goto LAB_002fe46f;
    }
  }
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_e70,local_f50._M_dataplus._M_p,local_f50._M_string_length);
LAB_002fe46f:
  local_e50 = &local_e40;
  puVar3 = (ulong *)(pbVar5->_M_dataplus)._M_p;
  paVar1 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3 == paVar1) {
    local_e40 = paVar1->_M_allocated_capacity;
    uStack_e38 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_e40 = paVar1->_M_allocated_capacity;
    local_e50 = puVar3;
  }
  local_e28 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar5->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_e50 == &local_e40) {
    uStack_e18 = uStack_e38;
    local_e30 = &local_e20;
  }
  else {
    local_e30 = local_e50;
  }
  local_e20 = local_e40;
  local_e48 = 0;
  local_e40 = local_e40 & 0xffffffffffffff00;
  pcVar9 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/transactions.cpp:285:9)>
           ::_M_manager;
  description_05._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/transactions.cpp:285:9)>
       ::_M_invoke;
  description_05._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/transactions.cpp:285:9)>
                ::_M_manager;
  description_05.field_2 = in_stack_ffffffffffffef78;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar10;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar16;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar11;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar12;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffefa0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar13;
  examples.m_examples._M_string_length = in_stack_ffffffffffffefc0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar14;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar15;
  examples.m_examples.field_2._8_8_ = pRVar17;
  local_e50 = &local_e40;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xffffffffffffef58)),description_05,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar9 != (code *)0x0) {
    (*pcVar9)(&stack0xffffffffffffef58,&stack0xffffffffffffef58,3);
  }
  if (local_e30 != &local_e20) {
    operator_delete(local_e30,local_e20 + 1);
  }
  if (local_e50 != &local_e40) {
    operator_delete(local_e50,local_e40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f50._M_dataplus._M_p != &local_f50.field_2) {
    operator_delete(local_f50._M_dataplus._M_p,local_f50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f90._M_dataplus._M_p != &local_f90.field_2) {
    operator_delete(local_f90._M_dataplus._M_p,local_f90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f70._M_dataplus._M_p != &local_f70.field_2) {
    operator_delete(local_f70._M_dataplus._M_p,local_f70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e70._M_dataplus._M_p != &local_e70.field_2) {
    operator_delete(local_e70._M_dataplus._M_p,local_e70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ef0._M_dataplus._M_p != &local_ef0.field_2) {
    operator_delete(local_ef0._M_dataplus._M_p,local_ef0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f30._M_dataplus._M_p != &local_f30.field_2) {
    operator_delete(local_f30._M_dataplus._M_p,local_f30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f10._M_dataplus._M_p != &local_f10.field_2) {
    operator_delete(local_f10._M_dataplus._M_p,local_f10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90._M_dataplus._M_p != &local_e90.field_2) {
    operator_delete(local_e90._M_dataplus._M_p,local_e90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ed0._M_dataplus._M_p != &local_ed0.field_2) {
    operator_delete(local_ed0._M_dataplus._M_p,local_ed0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_eb0._M_dataplus._M_p != &local_eb0.field_2) {
    operator_delete(local_eb0._M_dataplus._M_p,local_eb0.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_fc8.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e8.m_cond._M_dataplus._M_p != &local_9e8.m_cond.field_2) {
    operator_delete(local_9e8.m_cond._M_dataplus._M_p,
                    local_9e8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e8.m_description._M_dataplus._M_p != &local_9e8.m_description.field_2) {
    operator_delete(local_9e8.m_description._M_dataplus._M_p,
                    local_9e8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_9e8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e8.m_key_name._M_dataplus._M_p != &local_9e8.m_key_name.field_2) {
    operator_delete(local_9e8.m_key_name._M_dataplus._M_p,
                    local_9e8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff020);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab0.m_cond._M_dataplus._M_p != &local_ab0.m_cond.field_2) {
    operator_delete(local_ab0.m_cond._M_dataplus._M_p,
                    local_ab0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab0.m_description._M_dataplus._M_p != &local_ab0.m_description.field_2) {
    operator_delete(local_ab0.m_description._M_dataplus._M_p,
                    local_ab0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ab0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab0.m_key_name._M_dataplus._M_p != &local_ab0.m_key_name.field_2) {
    operator_delete(local_ab0.m_key_name._M_dataplus._M_p,
                    local_ab0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff008);
  lVar7 = 0x220;
  do {
    if ((long *)(local_d20 + lVar7) != *(long **)((long)local_d30 + lVar7)) {
      operator_delete(*(long **)((long)local_d30 + lVar7),*(long *)(local_d20 + lVar7) + 1);
    }
    if ((long *)((long)local_d40 + lVar7) != *(long **)((long)local_d50 + lVar7)) {
      operator_delete(*(long **)((long)local_d50 + lVar7),*(long *)((long)local_d40 + lVar7) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_d70.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar7));
    if ((long *)((long)local_d80 + lVar7) != *(long **)((long)local_d90 + lVar7)) {
      operator_delete(*(long **)((long)local_d90 + lVar7),*(long *)((long)local_d80 + lVar7) + 1);
    }
    lVar7 = lVar7 + -0x88;
  } while (lVar7 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffef88);
  if (local_e10[0] != local_e00) {
    operator_delete(local_e10[0],local_e00[0] + 1);
  }
  if (local_df0[0] != local_de0) {
    operator_delete(local_df0[0],local_de0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffefa8);
  if (local_dd0[0] != local_dc0) {
    operator_delete(local_dd0[0],local_dc0[0] + 1);
  }
  if (local_db0[0] != local_da0) {
    operator_delete(local_db0[0],local_da0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffefc8);
  if (local_d90[0] != local_d80) {
    operator_delete(local_d90[0],local_d80[0] + 1);
  }
  if (local_d70.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_d70.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_d70.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_d70.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffefe8);
  if (local_d50[0] != local_d40) {
    operator_delete(local_d50[0],local_d40[0] + 1);
  }
  if (local_d30[0] != (pointer)local_d20) {
    operator_delete(local_d30[0],local_d20._0_8_ + 1);
  }
  if (local_af0[0] != local_ae0) {
    operator_delete(local_af0[0],local_ae0[0] + 1);
  }
  if (local_ad0[0] != local_ac0) {
    operator_delete(local_ad0[0],local_ac0[0] + 1);
  }
  if (local_a28[0] != local_a18) {
    operator_delete(local_a28[0],local_a18[0] + 1);
  }
  if (local_a08[0] != local_9f8) {
    operator_delete(local_a08[0],local_9f8[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_fa8);
  lVar7 = 0x420;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_4b8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar7));
    if ((long *)(local_518 + lVar7 + 0x50) != *(long **)(local_518 + lVar7 + 0x40)) {
      operator_delete(*(long **)(local_518 + lVar7 + 0x40),*(long *)(local_518 + lVar7 + 0x50) + 1);
    }
    if ((long *)(local_518 + lVar7 + 0x28) != *(long **)(local_518 + lVar7 + 0x18)) {
      operator_delete(*(long **)(local_518 + lVar7 + 0x18),*(long *)(local_518 + lVar7 + 0x28) + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(local_570 + lVar7 + 0x10));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)(auStack_578 + lVar7));
    if ((long *)((long)local_590 + lVar7) != *(long **)(local_5b0 + lVar7 + 0x10)) {
      operator_delete(*(long **)(local_5b0 + lVar7 + 0x10),*(long *)((long)local_590 + lVar7) + 1);
    }
    lVar7 = lVar7 + -0x108;
  } while (lVar7 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_938);
  if (local_958 != &local_948) {
    operator_delete(local_958,CONCAT71(uStack_947,local_948) + 1);
  }
  if (local_918[0] != local_908) {
    operator_delete(local_918[0],local_908[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_8a0._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_8f8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_8f8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f8.val._M_dataplus._M_p != &local_8f8.val.field_2) {
    operator_delete(local_8f8.val._M_dataplus._M_p,
                    CONCAT71(local_8f8.val.field_2._M_allocated_capacity._1_7_,
                             local_8f8.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_840[0] != local_830) {
    operator_delete(local_840[0],local_830[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_7f8);
  if (local_818 != &local_808) {
    operator_delete(local_818,CONCAT71(uStack_807,local_808) + 1);
  }
  if (local_7d8[0] != local_7c8) {
    operator_delete(local_7d8[0],local_7c8[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_798._M_first);
  if (local_7b8 != &local_7a8) {
    operator_delete(local_7b8,CONCAT44(uStack_7a4,local_7a8) + 1);
  }
  if (local_738[0] != local_728) {
    operator_delete(local_738[0],local_728[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_6f0);
  if (local_710 != &local_700) {
    operator_delete(local_710,CONCAT71(uStack_6ff,local_700) + 1);
  }
  if (local_6d0[0] != local_6c0) {
    operator_delete(local_6d0[0],local_6c0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_658._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_6b0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6b0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0.val._M_dataplus._M_p != &local_6b0.val.field_2) {
    operator_delete(local_6b0.val._M_dataplus._M_p,
                    CONCAT71(local_6b0.val.field_2._M_allocated_capacity._1_7_,
                             local_6b0.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_5f8[0] != local_5e8) {
    operator_delete(local_5f8[0],local_5e8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_5b0);
  if (local_5d0 != &local_5c0) {
    operator_delete(local_5d0,CONCAT71(uStack_5bf,local_5c0) + 1);
  }
  if (local_590[0] != &local_580) {
    operator_delete(local_590[0],local_580 + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)local_518);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_530);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_548);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._8_8_ != &local_558) {
    operator_delete((void *)local_570._8_8_,
                    CONCAT71(local_558._M_allocated_capacity._1_7_,local_558._M_local_buf[0]) + 1);
  }
  if (local_4b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_4b8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_4b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_4b8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listreceivedbylabel()
{
    return RPCHelpMan{"listreceivedbylabel",
                "\nList received transactions by label.\n",
                {
                    {"minconf", RPCArg::Type::NUM, RPCArg::Default{1}, "The minimum number of confirmations before payments are included."},
                    {"include_empty", RPCArg::Type::BOOL, RPCArg::Default{false}, "Whether to include labels that haven't received any payments."},
                    {"include_watchonly", RPCArg::Type::BOOL, RPCArg::DefaultHint{"true for watch-only wallets, otherwise false"}, "Whether to include watch-only addresses (see 'importaddress')"},
                    {"include_immature_coinbase", RPCArg::Type::BOOL, RPCArg::Default{false}, "Include immature coinbase transactions."},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::BOOL, "involvesWatchonly", /*optional=*/true, "Only returns true if imported addresses were involved in transaction"},
                            {RPCResult::Type::STR_AMOUNT, "amount", "The total amount received by addresses with this label"},
                            {RPCResult::Type::NUM, "confirmations", "The number of confirmations of the most recent transaction included"},
                            {RPCResult::Type::STR, "label", "The label of the receiving address. The default label is \"\""},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("listreceivedbylabel", "")
            + HelpExampleCli("listreceivedbylabel", "6 true")
            + HelpExampleRpc("listreceivedbylabel", "6, true, true, true")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    const bool include_immature_coinbase{request.params[3].isNull() ? false : request.params[3].get_bool()};

    LOCK(pwallet->cs_wallet);

    return ListReceived(*pwallet, request.params, true, include_immature_coinbase);
},
    };
}